

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RoboSimian::RoboSimian
          (RoboSimian *this,ChSystem *system,bool has_sled,bool fixed)

{
  int iVar1;
  ContactManager *this_00;
  ContactMaterial *this_01;
  void *local_b8;
  allocator local_2e;
  allocator local_2d [19];
  byte local_1a;
  byte local_19;
  bool fixed_local;
  ChSystem *pCStack_18;
  bool has_sled_local;
  ChSystem *system_local;
  RoboSimian *this_local;
  
  this->m_system = system;
  this->m_owns_system = false;
  local_1a = fixed;
  local_19 = has_sled;
  pCStack_18 = system;
  system_local = (ChSystem *)this;
  std::shared_ptr<chrono::robosimian::RS_Chassis>::shared_ptr(&this->m_chassis);
  std::shared_ptr<chrono::robosimian::RS_Sled>::shared_ptr(&this->m_sled);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  ::vector(&this->m_limbs);
  this->m_wheel_mode = SPEED;
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_chassis_material);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_sled_material);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_wheel_material);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_link_material);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_wheelDD_material);
  this->m_wheel_friction = 0.8;
  this->m_sled_friction = 0.8;
  std::shared_ptr<chrono::robosimian::RS_Driver>::shared_ptr(&this->m_driver);
  this_00 = (ContactManager *)operator_new(0x10);
  ContactManager::ContactManager(this_00);
  this->m_contact_reporter = this_00;
  this->m_material_override = (ContactMaterial *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_outdir,"",local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_root,"results",&local_2e);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  local_b8 = &this->field_0x108;
  do {
    std::ofstream::ofstream(local_b8);
    local_b8 = (void *)((long)local_b8 + 0x200);
  } while ((RoboSimian *)local_b8 != this + 1);
  Create(this,(bool)(local_19 & 1),(bool)(local_1a & 1));
  iVar1 = (**(code **)(*(long *)pCStack_18 + 0x178))();
  if (iVar1 == 0) {
    this_01 = (ContactMaterial *)operator_new(0x10);
    ContactMaterial::ContactMaterial(this_01,this);
    this->m_material_override = this_01;
  }
  return;
}

Assistant:

RoboSimian::RoboSimian(ChSystem* system, bool has_sled, bool fixed)
    : m_owns_system(false),
      m_system(system),
      m_wheel_mode(ActuationMode::SPEED),
      m_contact_reporter(new ContactManager),
      m_material_override(nullptr),
      m_sled_friction(0.8f),
      m_wheel_friction(0.8f),
      m_outdir(""),
      m_root("results") {
    Create(has_sled, fixed);

    //// TODO: currently, only NSC multicore systems support user override of composite materials
    if (system->GetContactMethod() == ChContactMethod::NSC) {
        m_material_override = new ContactMaterial(this);
    }
}